

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall Operand::Operand(Operand *this,int intconst)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  
  this->kind = 2;
  __val = -intconst;
  if (0 < intconst) {
    __val = intconst;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_0010d89c;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_0010d89c;
      }
      if (uVar2 < 10000) goto LAB_0010d89c;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_0010d89c:
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  std::__cxx11::string::_M_construct((ulong)&this->value,(char)__len - (char)(intconst >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((this->value)._M_dataplus._M_p + ((uint)intconst >> 0x1f),__len,__val);
  this->active = -1;
  return;
}

Assistant:

Operand(int intconst): kind(OP_INTCONST), value(to_string(intconst)), active(-1) {}